

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char *in_whitespace_begin,
          char *in_whitespace_end)

{
  size_t sVar1;
  bool bVar2;
  jessilib *pjVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  anon_class_16_2_5d41347b is_whitespace;
  anon_class_16_2_5d41347b local_40;
  
  if ((long)in_whitespace_begin - (long)end == 1) {
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
              (__return_storage_ptr__,this,begin,(char *)(ulong)(uint)(int)*end,
               (char)in_whitespace_begin);
    return __return_storage_ptr__;
  }
  if (begin <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  if (end < in_whitespace_begin) {
    pcVar5 = begin + ~(ulong)this;
    local_40.in_whitespace_begin = end;
    local_40.in_whitespace_end = in_whitespace_begin;
    while ((this != (jessilib *)begin &&
           (bVar2 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                    ::anon_class_16_2_5d41347b::operator()(&local_40,(ElementT)*this), bVar2))) {
      this = this + 1;
      pcVar5 = pcVar5 + -1;
    }
    for (sVar4 = 0; this + sVar4 < begin; sVar4 = sVar4 + 1) {
      bVar2 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              ::anon_class_16_2_5d41347b::operator()(&local_40,(ElementT)this[sVar4]);
      if (bVar2) {
        pjVar3 = this + sVar4;
        sVar1 = (long)pcVar5 - sVar4;
        goto LAB_001072fb;
      }
    }
    (__return_storage_ptr__->first)._M_len = (size_t)(pcVar5 + 1);
  }
  else {
    (__return_storage_ptr__->first)._M_len = (long)begin - (long)this;
  }
  (__return_storage_ptr__->first)._M_str = (char *)this;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  return __return_storage_ptr__;
  while( true ) {
    bVar2 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            ::anon_class_16_2_5d41347b::operator()(&local_40,(ElementT)*pjVar3);
    sVar1 = sVar6 - 1;
    if (!bVar2) break;
LAB_001072fb:
    sVar6 = sVar1;
    pjVar3 = pjVar3 + 1;
    if (pjVar3 == (jessilib *)begin) break;
  }
  (__return_storage_ptr__->first)._M_len = sVar4;
  (__return_storage_ptr__->first)._M_str = (char *)this;
  (__return_storage_ptr__->second)._M_len = sVar6;
  (__return_storage_ptr__->second)._M_str = (char *)pjVar3;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, SpaceItrT in_whitespace_begin, SpaceEndT in_whitespace_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	if (std::distance(in_whitespace_begin, in_whitespace_end) == 1) {
		return word_split_once<OptionalMemberT...>(begin, end, *in_whitespace_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	if (in_whitespace_begin >= in_whitespace_end) {
		// Absent whitespace, therefore no match, therefore return input as single token
		result.first = make_word_split_member<MemberT>(begin, end);
		return result;
	}

	auto is_whitespace = [in_whitespace_begin, in_whitespace_end](ElementT in_element) {
		return std::find(in_whitespace_begin, in_whitespace_end, in_element) != in_whitespace_end;
	};

	// Skip over preceeding whitespace
	while (begin != end
		&& is_whitespace(*begin)) {
		++begin;
	}

	for (auto itr = begin; itr < end; ++itr) {
		if (is_whitespace(*itr)) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& is_whitespace(*itr)) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}